

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O0

void __thiscall despot::LaserTag::LaserTag(LaserTag *this,string *params_file)

{
  string local_38;
  string *local_18;
  string *params_file_local;
  LaserTag *this_local;
  
  local_18 = params_file;
  params_file_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)params_file);
  BaseTag::BaseTag(&this->super_BaseTag,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_BaseTag = &PTR__LaserTag_001599e8;
  *(undefined ***)&(this->super_BaseTag).super_BeliefMDP = &PTR__LaserTag_00159b18;
  *(undefined ***)&(this->super_BaseTag).super_StateIndexer = &PTR__LaserTag_00159c20;
  *(undefined ***)&(this->super_BaseTag).super_StatePolicy = &PTR__LaserTag_00159c58;
  *(undefined ***)&(this->super_BaseTag).super_MMAPInferencer = &PTR__LaserTag_00159c80;
  this->noise_sigma_ = 2.5;
  this->unit_size_ = 1.0;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->reading_distributions_);
  Init(this);
  (this->super_BaseTag).robot_pos_unknown_ = false;
  return;
}

Assistant:

LaserTag::LaserTag(string params_file) :
	BaseTag(params_file),
	noise_sigma_(2.5),
	unit_size_(1.0) {
	Init();
  robot_pos_unknown_ = false;
}